

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalDefinition.cpp
# Opt level: O3

void __thiscall
license::locate::ExternalDefinition::ExternalDefinition
          (ExternalDefinition *this,LicenseLocation *location)

{
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ExternalDefinition","");
  (this->super_LocatorStrategy)._vptr_LocatorStrategy =
       (_func_int **)&PTR_get_strategy_name_abi_cxx11__001cf780;
  (this->super_LocatorStrategy).m_strategy_name._M_dataplus._M_p =
       (pointer)&(this->super_LocatorStrategy).m_strategy_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_LocatorStrategy).m_strategy_name,local_40,local_40 + local_38);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  (this->super_LocatorStrategy)._vptr_LocatorStrategy =
       (_func_int **)&PTR_get_strategy_name_abi_cxx11__001cf730;
  this->m_location = location;
  return;
}

Assistant:

ExternalDefinition::ExternalDefinition(const LicenseLocation *location)
	: LocatorStrategy("ExternalDefinition"), m_location(location) {}